

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O2

bool __thiscall
cppnet::TimerContainer::InnerAddTimer
          (TimerContainer *this,shared_ptr<cppnet::TimerSlot> *ptr,uint32_t time)

{
  TIME_UNIT tu;
  TimerSlot *this_00;
  bool bVar1;
  uint16_t type;
  mapped_type *this_01;
  mapped_type *this_02;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint local_48;
  uint local_44;
  __weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar1 = false;
  if (time <= this->_timer_max) {
    tu = this->_time_unit;
    uVar4 = time % tu;
    uVar2 = time / tu + this->_cur_time;
    uVar3 = this->_size;
    if ((uVar2 & 0xffff) < this->_size) {
      uVar3 = 0;
    }
    uVar2 = uVar2 - uVar3;
    if ((this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      uVar4 = 0;
    }
    this_00 = (ptr->super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_48 = uVar4;
    type = TimeUnit2TimeType((TimerContainer *)(ulong)uVar3,tu);
    uVar3 = uVar2 & 0xffff;
    TimerSlot::SetCurIndex(this_00,(uint16_t)uVar2,type);
    TimerSlot::TimePass((ptr->super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,time - uVar4);
    local_44 = uVar3;
    this_01 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->_timer_wheel,&local_44);
    this_02 = std::
              map<unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>_>_>_>
              ::operator[](this_01,&local_48);
    std::__weak_ptr<cppnet::TimerSlot,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<cppnet::TimerSlot,void>
              (local_40,&ptr->super___shared_ptr<cppnet::TimerSlot,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::
    list<std::weak_ptr<cppnet::TimerSlot>,_std::allocator<std::weak_ptr<cppnet::TimerSlot>_>_>::
    push_back(this_02,(value_type *)local_40);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_38);
    bVar1 = Bitmap::Insert(&this->_bitmap,uVar3);
  }
  return bVar1;
}

Assistant:

bool TimerContainer::InnerAddTimer(std::shared_ptr<TimerSlot> ptr, uint32_t time) {
    if (time > _timer_max) {
        return false;
    }
    
    uint16_t cur_index = time / _time_unit + _cur_time;
    if (cur_index >= _size) {
        cur_index -= _size;
    }
    uint32_t left_time = time % _time_unit;
    // don't have sub timer
    if (!_sub_timer) {
        left_time = 0;
    }
    ptr->SetCurIndex(cur_index, TimeUnit2TimeType(_time_unit));
    ptr->TimePass(time - left_time);

    _timer_wheel[cur_index][left_time].push_back(ptr);
    return _bitmap.Insert(cur_index);
}